

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O1

void TrainModel(void)

{
  int *piVar1;
  longlong lVar2;
  longlong lVar3;
  int iVar4;
  pthread_t *__ptr;
  FILE *__stream;
  void *__ptr_00;
  void *__s;
  ulong uVar5;
  FILE *__stream_00;
  real *prVar6;
  long extraout_RDX;
  long lVar7;
  ulong uVar8;
  uint in_ESI;
  long lVar9;
  char *__s1;
  long lVar10;
  undefined4 uVar11;
  long lVar12;
  void *pvVar13;
  ulong uVar14;
  pthread_t *__newthread;
  void *pvVar15;
  float fVar16;
  float fVar17;
  
  __s1 = (char *)((long)num_threads << 3);
  __ptr = (pthread_t *)malloc((size_t)__s1);
  if (__ptr == (pthread_t *)0x0) {
    TrainModel_cold_3();
  }
  else {
    printf("Starting training using file %s\n");
    starting_alpha = alpha;
    if (read_vocab_file[0] == '\0') {
      LearnVocabFromTrainFile();
    }
    else {
      ReadVocab();
    }
    if (save_vocab_file[0] != '\0') {
      SaveVocab();
    }
    if (output_file[0] == '\0') {
      return;
    }
    InitNet();
    if (0 < negative) {
      InitUnigramTable();
    }
    puts("Starting to learn");
    start = clock();
    if (0 < num_threads) {
      pvVar15 = (void *)0x0;
      __newthread = __ptr;
      do {
        pthread_create(__newthread,(pthread_attr_t *)0x0,TrainModelThread,pvVar15);
        pvVar15 = (void *)((long)pvVar15 + 1);
        __newthread = __newthread + 1;
      } while ((long)pvVar15 < (long)num_threads);
    }
    if (0 < num_threads) {
      lVar7 = 0;
      do {
        pthread_join(__ptr[lVar7],(void **)0x0);
        lVar7 = lVar7 + 1;
      } while (lVar7 < num_threads);
    }
    __s1 = output_file;
    in_ESI = 0x1050b3;
    __stream = fopen(output_file,"wb");
    lVar2 = classes;
    if (__stream != (FILE *)0x0) {
      if (classes == 0) {
        fprintf(__stream,"%lld %lld\n",vocab_size,layer1_size);
        if (0 < vocab_size) {
          lVar7 = 0;
          lVar9 = 0;
          do {
            if (vocab[lVar9].word != (char *)0x0) {
              fprintf(__stream,"%s ");
            }
            if (binary == 0) {
              if (0 < layer1_size) {
                lVar10 = 0;
                do {
                  fprintf(__stream,"%lf ",
                          (double)*(float *)((long)syn0 + lVar10 * 4 + layer1_size * lVar7));
                  lVar10 = lVar10 + 1;
                } while (lVar10 < layer1_size);
              }
            }
            else if (0 < layer1_size) {
              lVar12 = 0;
              lVar10 = 0;
              do {
                fwrite((void *)((long)syn0 + lVar12 + layer1_size * lVar7),4,1,__stream);
                lVar10 = lVar10 + 1;
                lVar12 = lVar12 + 4;
              } while (lVar10 < layer1_size);
            }
            fputc(10,__stream);
            lVar9 = lVar9 + 1;
            lVar7 = lVar7 + 4;
          } while (lVar9 < vocab_size);
        }
        if (hs != 0) {
          __stream_00 = fopen(output_classifier,"ab");
          if (0 < vocab_size) {
            lVar7 = 0;
            lVar9 = 0;
            do {
              if (binary == 0) {
                if (0 < layer1_size) {
                  lVar10 = 0;
                  do {
                    fprintf(__stream_00,"%lf ",
                            (double)*(float *)((long)syn1 + lVar10 * 4 + layer1_size * lVar7));
                    lVar10 = lVar10 + 1;
                  } while (lVar10 < layer1_size);
                }
                fputc(10,__stream_00);
              }
              else if (0 < layer1_size) {
                lVar12 = 0;
                lVar10 = 0;
                do {
                  fwrite((void *)((long)syn1 + lVar12 + layer1_size * lVar7),4,1,__stream_00);
                  lVar10 = lVar10 + 1;
                  lVar12 = lVar12 + 4;
                } while (lVar10 < layer1_size);
              }
              lVar9 = lVar9 + 1;
              lVar7 = lVar7 + 4;
            } while (lVar9 < vocab_size);
          }
          fclose(__stream_00);
        }
LAB_00104737:
        fclose(__stream);
        free(table);
        free(__ptr);
        DestroyVocab();
        return;
      }
      __s1 = (char *)(classes * 4);
      pvVar15 = malloc((size_t)__s1);
      lVar3 = vocab_size;
      if (pvVar15 != (void *)0x0) {
        __ptr_00 = calloc(vocab_size,4);
        __s = calloc(layer1_size * lVar2,4);
        iVar4 = (int)lVar2;
        if (0 < lVar3) {
          lVar7 = 0;
          do {
            *(int *)((long)__ptr_00 + lVar7 * 4) = (int)(lVar7 % (long)iVar4);
            lVar7 = lVar7 + 1;
          } while (lVar3 != lVar7);
        }
        uVar8 = (ulong)iVar4;
        lVar7 = 0;
        do {
          lVar2 = layer1_size;
          if (0 < (long)(layer1_size * uVar8)) {
            memset(__s,0,uVar8 * 4 * layer1_size);
          }
          if (0 < (long)uVar8) {
            uVar5 = 0;
            do {
              *(undefined4 *)((long)pvVar15 + uVar5 * 4) = 1;
              uVar5 = uVar5 + 1;
            } while (uVar8 != uVar5);
          }
          lVar3 = vocab_size;
          if (0 < vocab_size) {
            lVar9 = 0;
            prVar6 = syn0;
            do {
              if (0 < lVar2) {
                lVar10 = *(int *)((long)__ptr_00 + lVar9 * 4) * lVar2;
                lVar12 = 0;
                do {
                  *(float *)((long)__s + lVar12 * 4 + lVar10 * 4) =
                       prVar6[lVar12] + *(float *)((long)__s + lVar12 * 4 + lVar10 * 4);
                  lVar12 = lVar12 + 1;
                } while (lVar2 != lVar12);
              }
              piVar1 = (int *)((long)pvVar15 + (long)*(int *)((long)__ptr_00 + lVar9 * 4) * 4);
              *piVar1 = *piVar1 + 1;
              lVar9 = lVar9 + 1;
              prVar6 = prVar6 + lVar2;
            } while (lVar9 != lVar3);
          }
          if (0 < (long)uVar8) {
            lVar9 = 0;
            uVar5 = 0;
            do {
              lVar2 = layer1_size;
              if (layer1_size < 1) {
                fVar16 = 0.0;
              }
              else {
                iVar4 = *(int *)((long)pvVar15 + uVar5 * 4);
                lVar10 = layer1_size * lVar9;
                fVar16 = 0.0;
                lVar12 = 0;
                do {
                  fVar17 = *(float *)((long)__s + lVar12 * 4 + lVar10) / (float)iVar4;
                  *(float *)((long)__s + lVar12 * 4 + lVar10) = fVar17;
                  fVar16 = fVar16 + fVar17 * fVar17;
                  lVar12 = lVar12 + 1;
                } while (lVar2 != lVar12);
              }
              if (fVar16 < 0.0) {
                fVar16 = sqrtf(fVar16);
              }
              else {
                fVar16 = SQRT(fVar16);
              }
              lVar2 = layer1_size;
              if (0 < layer1_size) {
                lVar10 = layer1_size * lVar9;
                lVar12 = 0;
                do {
                  *(float *)((long)__s + lVar12 * 4 + lVar10) =
                       *(float *)((long)__s + lVar12 * 4 + lVar10) / fVar16;
                  lVar12 = lVar12 + 1;
                } while (lVar2 != lVar12);
              }
              uVar5 = uVar5 + 1;
              lVar9 = lVar9 + 4;
            } while (uVar5 != uVar8);
          }
          lVar3 = vocab_size;
          lVar2 = layer1_size;
          if (0 < vocab_size) {
            lVar9 = layer1_size * 4;
            lVar10 = 0;
            prVar6 = syn0;
            do {
              uVar5 = 0;
              uVar11 = 0;
              if (0 < (long)uVar8) {
                fVar16 = -10.0;
                uVar14 = 0;
                pvVar13 = __s;
                do {
                  fVar17 = 0.0;
                  if (0 < lVar2) {
                    lVar12 = 0;
                    do {
                      fVar17 = fVar17 + *(float *)((long)pvVar13 + lVar12 * 4) * prVar6[lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar2 != lVar12);
                  }
                  if (fVar16 < fVar17) {
                    uVar5 = uVar14 & 0xffffffff;
                    fVar16 = fVar17;
                  }
                  uVar11 = (undefined4)uVar5;
                  uVar14 = uVar14 + 1;
                  pvVar13 = (void *)((long)pvVar13 + lVar9);
                } while (uVar14 != uVar8);
              }
              *(undefined4 *)((long)__ptr_00 + lVar10 * 4) = uVar11;
              lVar10 = lVar10 + 1;
              prVar6 = prVar6 + lVar2;
            } while (lVar10 != lVar3);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 10);
        if (0 < vocab_size) {
          lVar7 = 4;
          lVar9 = 0;
          do {
            fprintf(__stream,"%s %d\n",*(undefined8 *)((long)&vocab->cn + lVar7 * 4),
                    (ulong)*(uint *)((long)__ptr_00 + lVar9 * 4));
            lVar9 = lVar9 + 1;
            lVar7 = lVar7 + 10;
          } while (lVar9 < vocab_size);
        }
        free(pvVar15);
        free(__s);
        free(__ptr_00);
        goto LAB_00104737;
      }
      goto LAB_00104772;
    }
  }
  TrainModel_cold_2();
LAB_00104772:
  TrainModel_cold_1();
  if (1 < (int)in_ESI) {
    uVar8 = (ulong)in_ESI;
    lVar7 = 1;
    do {
      iVar4 = strcmp(__s1,*(char **)(extraout_RDX + lVar7 * 8));
      if (iVar4 == 0) {
        if ((int)uVar8 != 2) {
          return;
        }
        printf("Argument missing for %s\n",__s1);
        exit(1);
      }
      lVar7 = lVar7 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 1);
  }
  return;
}

Assistant:

void TrainModel() {
  long a, b, c, d;
  FILE *fo;
  pthread_t *pt = (pthread_t *)malloc(num_threads * sizeof(pthread_t));
  if (pt == NULL) {
    fprintf(stderr, "cannot allocate memory for threads\n");
    exit(1);
  }
  printf("Starting training using file %s\n", train_file);
  starting_alpha = alpha;
  if (read_vocab_file[0] != 0) ReadVocab(); else LearnVocabFromTrainFile();
  if (save_vocab_file[0] != 0) SaveVocab();
  if (output_file[0] == 0) return;
  InitNet();
  if (negative > 0) InitUnigramTable();
  printf("Starting to learn\n");
  start = clock();
  for (a = 0; a < num_threads; a++) pthread_create(&pt[a], NULL, TrainModelThread, (void *)a);
  for (a = 0; a < num_threads; a++) pthread_join(pt[a], NULL);
  fo = fopen(output_file, "wb");
  if (fo == NULL) {
    fprintf(stderr, "Cannot open %s: permission denied\n", output_file);
    exit(1);
  }
  if (classes == 0) {
    // Save the word vectors
    fprintf(fo, "%lld %lld\n", vocab_size, layer1_size);
    for (a = 0; a < vocab_size; a++) {
      if (vocab[a].word != NULL) {
        fprintf(fo, "%s ", vocab[a].word);
      }
      if (binary) for (b = 0; b < layer1_size; b++) fwrite(&syn0[a * layer1_size + b], sizeof(real), 1, fo);
      else for (b = 0; b < layer1_size; b++) fprintf(fo, "%lf ", syn0[a * layer1_size + b]);
      fprintf(fo, "\n");
    }

    // Save the classifier
    if (output_classifier && hs) {
      // append to the tree that was already output
      FILE * fhs = fopen(output_classifier, "ab");
      // output the layer
      for (a = 0; a < vocab_size; a++) {
        if (binary) {
          for (b = 0; b < layer1_size; b++) fwrite(&syn1[a * layer1_size + b], sizeof(real), 1, fhs);
        } else {
          for (b = 0; b < layer1_size; b++) fprintf(fhs, "%lf ", syn1[a * layer1_size + b]);
          fprintf(fhs, "\n");
        }
      }
      fclose(fhs);
    }
  } else {
    // Run K-means on the word vectors
    int clcn = classes, iter = 10, closeid;
    int *centcn = (int *)malloc(classes * sizeof(int));
    if (centcn == NULL) {
      fprintf(stderr, "cannot allocate memory for centcn\n");
      exit(1);
    }
    int *cl = (int *)calloc(vocab_size, sizeof(int));
    real closev, x;
    real *cent = (real *)calloc(classes * layer1_size, sizeof(real));
    for (a = 0; a < vocab_size; a++) cl[a] = a % clcn;
    for (a = 0; a < iter; a++) {
      for (b = 0; b < clcn * layer1_size; b++) cent[b] = 0;
      for (b = 0; b < clcn; b++) centcn[b] = 1;
      for (c = 0; c < vocab_size; c++) {
        for (d = 0; d < layer1_size; d++) cent[layer1_size * cl[c] + d] += syn0[c * layer1_size + d];
        centcn[cl[c]]++;
      }
      for (b = 0; b < clcn; b++) {
        closev = 0;
        for (c = 0; c < layer1_size; c++) {
          cent[layer1_size * b + c] /= centcn[b];
          closev += cent[layer1_size * b + c] * cent[layer1_size * b + c];
        }
        closev = sqrt(closev);
        for (c = 0; c < layer1_size; c++) cent[layer1_size * b + c] /= closev;
      }
      for (c = 0; c < vocab_size; c++) {
        closev = -10;
        closeid = 0;
        for (d = 0; d < clcn; d++) {
          x = 0;
          for (b = 0; b < layer1_size; b++) x += cent[layer1_size * d + b] * syn0[c * layer1_size + b];
          if (x > closev) {
            closev = x;
            closeid = d;
          }
        }
        cl[c] = closeid;
      }
    }
    // Save the K-means classes
    for (a = 0; a < vocab_size; a++) fprintf(fo, "%s %d\n", vocab[a].word, cl[a]);
    free(centcn);
    free(cent);
    free(cl);
  }
  fclose(fo);
  free(table);
  free(pt);
  DestroyVocab();
}